

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O2

TextureFormatInfo * __thiscall
Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::GetTextureFormatInfo
          (RenderDeviceBase<Diligent::EngineGLImplTraits> *this,TEXTURE_FORMAT TexFormat)

{
  pointer pvVar1;
  string msg;
  string local_38;
  
  if (TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB < TexFormat) {
    FormatString<char[28]>(&local_38,(char (*) [28])"Texture format out of range");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetTextureFormatInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0x110);
    std::__cxx11::string::~string((string *)&local_38);
  }
  pvVar1 = (this->m_TextureFormatsInfo).
           super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar1[TexFormat].super_TextureFormatInfo.super_TextureFormatAttribs.Format != TexFormat) {
    FormatString<char[20]>(&local_38,(char (*) [20])"Sanity check failed");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetTextureFormatInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0x112);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return &pvVar1[TexFormat].super_TextureFormatInfo;
}

Assistant:

GetTextureFormatInfo(TEXTURE_FORMAT TexFormat) const override final
    {
        VERIFY(TexFormat >= TEX_FORMAT_UNKNOWN && TexFormat < TEX_FORMAT_NUM_FORMATS, "Texture format out of range");
        const TextureFormatInfoExt& TexFmtInfo = m_TextureFormatsInfo[TexFormat];
        VERIFY(TexFmtInfo.Format == TexFormat, "Sanity check failed");
        return TexFmtInfo;
    }